

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  vector<wabt::Error,std::allocator<wabt::Error>> *this_00;
  bool bVar1;
  TokenType TVar2;
  TokenType TVar3;
  Result RVar4;
  Script *script;
  long *plVar5;
  TokenTypePair pair;
  long lVar6;
  ErrorLevel local_9c;
  Location local_98;
  undefined1 local_70 [32];
  long *local_50 [2];
  long local_40 [2];
  
  script = (Script *)operator_new(0x50);
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  *(undefined8 *)
   &(script->module_bindings).
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy = 0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets =
       &(script->module_bindings).
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_single_bucket;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 1;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  TVar2 = Peek(this,0);
  TVar3 = Peek(this,1);
  pair._M_elems[1] = TVar3;
  pair._M_elems[0] = TVar2;
  bVar1 = anon_unknown_1::IsModuleField(pair);
  if ((bVar1) || (bVar1 = PeekIsCustom(this), bVar1)) {
    plVar5 = (long *)operator_new(0x3d0);
    memset(plVar5,0,0x3b0);
    *plVar5 = (long)&PTR__ModuleCommand_001a3858;
    plVar5[2] = 0;
    plVar5[3] = 0;
    *(undefined8 *)((long)plVar5 + 0x1c) = 0;
    *(undefined8 *)((long)plVar5 + 0x24) = 0;
    plVar5[6] = (long)(plVar5 + 8);
    plVar5[10] = 0;
    plVar5[0xb] = 0;
    plVar5[0xc] = 0;
    plVar5[0xd] = 0;
    *(undefined8 *)((long)plVar5 + 0x6c) = 0;
    *(undefined8 *)((long)plVar5 + 0x74) = 0;
    memset(plVar5 + 0x10,0,0x120);
    plVar5[0x34] = (long)(plVar5 + 0x3a);
    plVar5[0x35] = 1;
    plVar5[0x36] = 0;
    plVar5[0x37] = 0;
    *(undefined4 *)(plVar5 + 0x38) = 0x3f800000;
    plVar5[0x39] = 0;
    plVar5[0x3a] = 0;
    plVar5[0x3b] = (long)(plVar5 + 0x41);
    plVar5[0x3c] = 1;
    plVar5[0x3d] = 0;
    plVar5[0x3e] = 0;
    *(undefined4 *)(plVar5 + 0x3f) = 0x3f800000;
    plVar5[0x40] = 0;
    plVar5[0x41] = 0;
    plVar5[0x42] = (long)(plVar5 + 0x48);
    plVar5[0x43] = 1;
    plVar5[0x44] = 0;
    plVar5[0x45] = 0;
    *(undefined4 *)(plVar5 + 0x46) = 0x3f800000;
    plVar5[0x47] = 0;
    plVar5[0x48] = 0;
    plVar5[0x49] = (long)(plVar5 + 0x4f);
    plVar5[0x4a] = 1;
    plVar5[0x4b] = 0;
    plVar5[0x4c] = 0;
    *(undefined4 *)(plVar5 + 0x4d) = 0x3f800000;
    plVar5[0x4e] = 0;
    plVar5[0x4f] = 0;
    plVar5[0x50] = (long)(plVar5 + 0x56);
    plVar5[0x51] = 1;
    plVar5[0x52] = 0;
    plVar5[0x53] = 0;
    *(undefined4 *)(plVar5 + 0x54) = 0x3f800000;
    plVar5[0x55] = 0;
    plVar5[0x56] = 0;
    plVar5[0x57] = (long)(plVar5 + 0x5d);
    plVar5[0x58] = 1;
    plVar5[0x59] = 0;
    plVar5[0x5a] = 0;
    *(undefined4 *)(plVar5 + 0x5b) = 0x3f800000;
    plVar5[0x5c] = 0;
    plVar5[0x5d] = 0;
    plVar5[0x5e] = (long)(plVar5 + 100);
    plVar5[0x5f] = 1;
    plVar5[0x60] = 0;
    plVar5[0x61] = 0;
    *(undefined4 *)(plVar5 + 0x62) = 0x3f800000;
    plVar5[99] = 0;
    plVar5[100] = 0;
    plVar5[0x65] = (long)(plVar5 + 0x6b);
    plVar5[0x66] = 1;
    plVar5[0x67] = 0;
    plVar5[0x68] = 0;
    *(undefined4 *)(plVar5 + 0x69) = 0x3f800000;
    plVar5[0x6a] = 0;
    plVar5[0x6b] = 0;
    plVar5[0x6c] = (long)(plVar5 + 0x72);
    plVar5[0x6d] = 1;
    plVar5[0x6e] = 0;
    plVar5[0x6f] = 0;
    *(undefined4 *)(plVar5 + 0x70) = 0x3f800000;
    plVar5[0x76] = 0;
    plVar5[0x71] = 0;
    plVar5[0x72] = 0;
    *(undefined4 *)((long)plVar5 + 0x397) = 0;
    plVar5[0x77] = (long)(plVar5 + 0x75);
    plVar5[0x78] = (long)(plVar5 + 0x75);
    plVar5[0x79] = 0;
    local_98.filename._M_len = (size_t)plVar5;
    GetToken((Token *)local_70,this);
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)(plVar5 + 4))->offset
         = local_70._16_8_;
    plVar5[5] = local_70._24_8_;
    plVar5[2] = local_70._0_8_;
    plVar5[3] = local_70._8_8_;
    RVar4 = ParseModuleFieldList(this,(Module *)(plVar5 + 2));
    if (RVar4.enum_ == Error) {
      (**(code **)(*plVar5 + 8))(plVar5);
      goto LAB_0013a6b5;
    }
    std::
    vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
    ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
              ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                *)script,
               (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
               &local_98);
    if ((long *)local_98.filename._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_98.filename._M_len + 8))();
      goto joined_r0x0013a52f;
    }
  }
  else {
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
    if (((TVar2 == Lpar) && (TVar3 < Result)) &&
       ((0x421190003f8U >> ((ulong)TVar3 & 0x3f) & 1) != 0)) {
      RVar4 = ParseCommandList(this,script,(CommandPtrVector *)script);
joined_r0x0013a52f:
      if (RVar4.enum_ == Error) goto LAB_0013a6b5;
    }
    else {
      TVar2 = Peek(this,0);
      if (TVar2 == Eof) {
        this_00 = (vector<wabt::Error,std::allocator<wabt::Error>> *)this->errors_;
        local_9c = Warning;
        GetToken((Token *)local_70,this);
        local_98.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_70._16_8_
        ;
        local_98.field_1._8_8_ = local_70._24_8_;
        local_98.filename._M_len = local_70._0_8_;
        local_98.filename._M_str = (char *)local_70._8_8_;
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location,char_const(&)[13]>
                  (this_00,&local_9c,&local_98,(char (*) [13])"empty script");
      }
      else {
        Match(this,Lpar);
        local_70._0_8_ = local_70 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a module field","");
        plVar5 = local_40;
        local_50[0] = plVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a command","");
        local_98.filename._M_len = 0;
        local_98.filename._M_str = (char *)0x0;
        local_98.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   (string *)local_70,&stack0xffffffffffffffd0);
        ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_98,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        lVar6 = -0x40;
        do {
          if (plVar5 != (long *)plVar5[-2]) {
            operator_delete((long *)plVar5[-2],*plVar5 + 1);
          }
          plVar5 = plVar5 + -4;
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0);
      }
    }
  }
  RVar4 = Expect(this,Eof);
  if ((RVar4.enum_ != Error) && (bVar1 = HasError(this), !bVar1)) {
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               script);
    return (Result)Ok;
  }
LAB_0013a6b5:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 *)&script->module_bindings);
  std::
  vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ::~vector((vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             *)script);
  operator_delete(script,0x50);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = std::make_unique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair()) || PeekIsCustom()) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = std::make_unique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else if (PeekMatch(TokenType::Eof)) {
    errors_->emplace_back(ErrorLevel::Warning, GetLocation(), "empty script");
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (!HasError()) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}